

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O0

void writeHash2<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *keys,SeedType *seed,size_t n1,size_t n2,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vals,vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *layer1,string *hash_str,string *map_name,string *default_value,
               bool nonKeyLookups)

{
  uint16_t seed_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  uint32_t uVar3;
  value_type vVar4;
  iterator iVar5;
  iterator iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  reference pvVar8;
  reference pvVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  char *local_270;
  char *local_268;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  undefined1 local_250 [8];
  string upper_name;
  string local_210;
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  reference local_190;
  Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *bin;
  iterator __end0;
  iterator __begin0;
  vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  string local_d0;
  ushort local_aa;
  ulong local_a8;
  size_t final;
  uint32_t s1;
  uint32_t h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  size_t i_1;
  allocator<int> local_75;
  value_type_conflict4 local_74;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> mapping;
  bool nonKeyLookups_local;
  vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *layer1_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vals_local;
  size_t n2_local;
  size_t n1_local;
  SeedType *seed_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *keys_local;
  
  iVar5 = std::
          vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin(layer1);
  iVar6 = std::
          vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(layer1);
  std::
  sort<__gnu_cxx::__normal_iterator<Bin<std::__cxx11::string>*,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>>,writeHash2<std::__cxx11::string>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<Bin<std::__cxx11::string>,std::allocator<Bin<std::__cxx11::string>>>,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>
            (iVar5._M_current,iVar6._M_current);
  local_74 = -1;
  std::allocator<int>::allocator(&local_75);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_70,n2 + 1,&local_74,&local_75);
  std::allocator<int>::~allocator(&local_75);
  key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    pbVar1 = key;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(keys);
    if (pbVar7 <= pbVar1) break;
    _s1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](keys,(size_type)key);
    uVar3 = hash2(_s1,seed);
    final._4_4_ = uVar3 & (uint)n1;
    pvVar8 = std::
             vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](layer1,(ulong)final._4_4_);
    local_aa = pvVar8->seed;
    final._0_4_ = (uint)local_aa;
    uVar3 = hash2(_s1,&local_aa);
    local_a8 = uVar3 & n2;
    vVar4 = (value_type)key;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_70,local_a8);
    *pvVar9 = vVar4;
    key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key->field_0x1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e8,vals);
  std::__cxx11::string::string((string *)&local_108,(string *)map_name);
  getCommonCodeGen<std::__cxx11::string>
            (&local_d0,keys,&local_e8,(vector<int,_std::allocator<int>_> *)local_70,n2,&local_108,
             nonKeyLookups);
  std::__cxx11::string::operator=((string *)hash_str,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  std::__cxx11::to_string((string *)&i,n1 + 1);
  std::operator+(&local_148,"    static constexpr std::array<uint16_t, ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
  std::operator+(&local_128,&local_148,"> seeds {\n        ");
  std::__cxx11::string::operator+=((string *)hash_str,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&i);
  __range1 = (vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x0;
  __end0 = std::
           vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(layer1);
  bin = (Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        std::
        vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::end(layer1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&bin);
    if (!bVar2) break;
    local_190 = __gnu_cxx::
                __normal_iterator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator*(&__end0);
    if ((__range1 !=
         (vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x0) && ((ulong)__range1 % 10 == 0)) {
      std::__cxx11::string::operator+=((string *)hash_str,"\n        ");
    }
    __range1 = (vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&(__range1->
                          super__Vector_base<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::to_string(&local_1d0,(uint)local_190->seed);
    std::operator+(&local_1b0,&local_1d0,",");
    std::__cxx11::string::operator+=((string *)hash_str,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    __gnu_cxx::
    __normal_iterator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end0);
  }
  std::__cxx11::string::operator+=((string *)hash_str,"\n    };\n\n");
  pvVar10 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](keys,0);
  seed_00 = *seed;
  std::__cxx11::string::string((string *)&local_210,(string *)map_name);
  pvVar11 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](keys,0);
  typeStr((string *)((long)&upper_name.field_2 + 8),pvVar11);
  hashStr2(&local_1f0,pvVar10,seed_00,n1,n2,default_value,&local_210,
           (string *)((long)&upper_name.field_2 + 8),nonKeyLookups);
  std::__cxx11::string::operator+=((string *)hash_str,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)(upper_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string((string *)local_250,(string *)map_name);
  local_258._M_current = (char *)std::__cxx11::string::begin();
  local_260._M_current = (char *)std::__cxx11::string::end();
  local_268 = (char *)std::__cxx11::string::begin();
  local_270 = (char *)std::
                      transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                (local_258,local_260,
                                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_268,toupper);
  std::operator+(&local_2b0,"#endif // POIFECT_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
  std::operator+(&local_290,&local_2b0,"_H\n");
  std::__cxx11::string::operator+=((string *)hash_str,(string *)&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)local_250);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  return;
}

Assistant:

void writeHash2(const std::vector<KeyType>& keys,
               const SeedType& seed,
               size_t n1,
               size_t n2,
               const std::vector<std::string>& vals,
               std::vector<Bin<KeyType>> layer1,
               std::string& hash_str,
               std::string map_name,
               const std::string& default_value,
               bool nonKeyLookups){

    struct LayerSort{
        inline bool operator() (const Bin<KeyType>& a, const Bin<KeyType>& b){
            return (a.generating_hash < b.generating_hash);
        }
    };
    std::sort(layer1.begin(), layer1.end(), LayerSort());

    std::vector<int> mapping(n2+1, -1);
    for(size_t i = 0; i < keys.size(); i++){
        const KeyType& key = keys[i];
        uint32_t h = hash2(key, seed) & n1;
        uint32_t s1 = layer1[h].seed;
        size_t final = hash2(key, s1) & n2;
        mapping[final] = i;
    }

    hash_str = getCommonCodeGen(keys, vals, mapping, n2, map_name, nonKeyLookups);

    hash_str += "    static constexpr std::array<uint16_t, " + std::to_string(n1+1) + "> seeds {\n        ";

    size_t i = 0;
    for(const auto& bin : layer1){
        if(i && i%entries_per_row==0) hash_str += "\n        ";
        i++;
        hash_str += std::to_string(bin.seed) + ",";
    }
    hash_str += "\n    };\n\n";

    hash_str += hashStr2(keys[0], seed, n1, n2, default_value, map_name, typeStr(keys[0]), nonKeyLookups);

    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);
    hash_str += "#endif // POIFECT_" + upper_name + "_H\n";
}